

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_decode_bin(char **data,uint32_t *len)

{
  char *pcVar1;
  uint32_t uVar2;
  
  if (len != (uint32_t *)0x0) {
    uVar2 = mp_decode_binl(data);
    *len = uVar2;
    pcVar1 = *data;
    *data = pcVar1 + uVar2;
    return pcVar1;
  }
  __assert_fail("len != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x83d,"const char *mp_decode_bin(const char **, uint32_t *)");
}

Assistant:

MP_IMPL const char *
mp_decode_bin(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_binl(data);
	const char *str = *data;
	*data += *len;
	return str;
}